

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexImageCubeBufferCase::createTexture(TexImageCubeBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  pointer pvVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer data;
  deUint32 seed;
  int iVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__cur;
  int ndx;
  long lVar9;
  uint uVar10;
  int face;
  long lVar11;
  float fVar12;
  deUint32 buf;
  deUint32 tex;
  TransferFormat local_c0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b8;
  ulong local_a0;
  ulong local_98;
  TextureFormat *local_90;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_58;
  
  seed = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                      super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  tex = 0;
  this_01 = &(this->super_TextureCubeSpecCase).m_texFormat;
  local_c0 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  local_90 = this_01;
  iVar8 = tcu::TextureFormat::getPixelSize(this_01);
  iVar4 = (this->super_TextureCubeSpecCase).m_size;
  iVar7 = this->m_skipPixels + iVar4;
  if (0 < this->m_rowLength) {
    iVar7 = this->m_rowLength;
  }
  iVar5 = this->m_alignment;
  iVar6 = this->m_skipRows;
  local_b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x90);
  pvVar1 = local_b8.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 6;
  local_b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar1;
  memset(local_b8.
         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start,0,0x90);
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  local_b8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_a0 = (ulong)local_c0 >> 0x20;
  uVar10 = -iVar5 & (iVar5 + iVar7 * iVar8) - 1U;
  local_98 = (ulong)uVar10;
  lVar11 = 0;
  do {
    buf = 0;
    gMin.m_data[0] = 0.0;
    gMin.m_data[1] = 0.0;
    gMin.m_data[2] = 0.0;
    gMin.m_data[3] = 0.0;
    lVar9 = 0;
    do {
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar9];
      fVar3 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar9];
      fVar12 = deRandom_getFloat(&rnd.m_rnd);
      gMin.m_data[lVar9] = (fVar3 - fVar2) * fVar12 + fVar2;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    gMax.m_data[0] = 0.0;
    gMax.m_data[1] = 0.0;
    gMax.m_data[2] = 0.0;
    gMax.m_data[3] = 0.0;
    lVar9 = 0;
    do {
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar9];
      fVar3 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar9];
      fVar12 = deRandom_getFloat(&rnd.m_rnd);
      gMax.m_data[lVar9] = (fVar3 - fVar2) * fVar12 + fVar2;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (local_b8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar11,
               (long)(int)(this->m_offset + (iVar4 + iVar6) * uVar10));
    iVar7 = (this->super_TextureCubeSpecCase).m_size;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,local_90,iVar7,iVar7,1,(int)local_98,0,
               local_b8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start +
               (long)this->m_offset + (long)(this->m_skipPixels * iVar8) +
               (long)(this->m_skipRows * (int)local_98));
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
    sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
    data = local_b8.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar11].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    sglr::ContextWrapper::glBufferData
              (this_00,0x88ec,
               (long)(*(int *)&local_b8.
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar11].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (int)data),data,0x88e4);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
    iVar7 = (this->super_TextureCubeSpecCase).m_size;
    sglr::ContextWrapper::glTexImage2D
              (this_00,(&s_cubeMapFaces)[lVar11],0,this->m_internalFormat,iVar7,iVar7,0,
               local_c0.format,(deUint32)local_a0,(void *)(long)this->m_offset);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 6);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void createTexture (void)
	{
		de::Random					rnd			(deStringHash(getName()));
		deUint32					tex			= 0;
		glu::TransferFormat			fmt			= glu::getTransferFormat(m_texFormat);
		const int					pixelSize	= m_texFormat.getPixelSize();
		const int					rowLength	= m_rowLength > 0 ? m_rowLength : m_size + m_skipPixels;
		const int					rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
		const int					height		= m_size + m_skipRows;
		vector<vector<deUint8> >	data		(DE_LENGTH_OF_ARRAY(s_cubeMapFaces));

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
		{
			deUint32 buf = 0;

			{
				const Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				const Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				data[face].resize(rowPitch*height + m_offset);
				tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, rowPitch, 0, &data[face][0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), gMin, gMax);
			}

			// Create buffer and upload.
			glGenBuffers(1, &buf);
			glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
			glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data[face].size(), &data[face][0], GL_STATIC_DRAW);

			glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
			glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
			glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
			glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, fmt.format, fmt.dataType, (const void*)(deUintptr)m_offset);
		}
	}